

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O2

int do_late_binding(int argc,char **argv)

{
  long lVar1;
  byte bVar2;
  size_t sVar3;
  _Bool _Var4;
  int iVar5;
  uint uVar6;
  char **ppcVar7;
  byte bVar8;
  char *__format;
  char *pcVar9;
  char *p_path;
  int argc_1;
  char *pcVar10;
  long in_FS_OFFSET;
  size_t sStack_1080;
  undefined4 local_106c;
  long local_1060;
  uint32_t local_1054;
  size_t payload_size;
  char *device_path_found;
  igsc_device_handle handle;
  uint8_t payload [4096];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (argc < 1) {
    uVar6 = 0xffffffff;
    if (quiet != '\0') goto LAB_001087a7;
    pcVar9 = "Error: No arguments provided\n";
    sStack_1080 = 0x1d;
  }
  else {
    ppcVar7 = argv + 1;
    pcVar9 = (char *)0x0;
    p_path = (char *)0x0;
    local_1060 = 0;
    bVar8 = 0;
    local_106c = 0;
    bVar2 = 0;
    do {
      pcVar10 = ppcVar7[-1];
      _Var4 = arg_is_device(pcVar10);
      if (_Var4) {
        if (argc == 1) {
          uVar6 = 0xffffffff;
          if (quiet != '\0') goto LAB_001087a7;
          pcVar9 = "Error: No device to send the command to\n";
          sStack_1080 = 0x28;
          goto LAB_0010879e;
        }
        pcVar9 = *ppcVar7;
      }
      else {
        _Var4 = arg_is_token(pcVar10,"-p");
        if ((_Var4) || (_Var4 = arg_is_token(pcVar10,"--payload"), _Var4)) {
          if (argc == 1) {
            uVar6 = 0xffffffff;
            if (quiet != '\0') goto LAB_001087a7;
            pcVar9 = "Error: No payload file to send\n";
            sStack_1080 = 0x1f;
            goto LAB_0010879e;
          }
          p_path = *ppcVar7;
        }
        else {
          _Var4 = arg_is_token(pcVar10,"-f");
          if ((_Var4) || (_Var4 = arg_is_token(pcVar10,"--flags"), _Var4)) {
            if (argc == 1) {
              uVar6 = 0xffffffff;
              if (quiet != '\0') goto LAB_001087a7;
              pcVar9 = "Error: No flags argument provided\n";
              sStack_1080 = 0x22;
              goto LAB_0010879e;
            }
            local_1060 = strtol(*ppcVar7,(char **)0x0,0x10);
            bVar8 = 1;
          }
          else {
            _Var4 = arg_is_token(pcVar10,"-t");
            if ((!_Var4) && (_Var4 = arg_is_token(pcVar10,"--type"), !_Var4)) {
              uVar6 = 0xffffffff;
              if (quiet == '\0') {
                pcVar9 = "Error: Wrong argument %s\n";
LAB_001087eb:
                uVar6 = 0xffffffff;
                fprintf(_stderr,pcVar9,pcVar10);
              }
              goto LAB_001087a7;
            }
            if (argc == 1) {
              uVar6 = 0xffffffff;
              if (quiet != '\0') goto LAB_001087a7;
              pcVar9 = "Error: No payload type argument provided\n";
              sStack_1080 = 0x29;
              goto LAB_0010879e;
            }
            pcVar10 = *ppcVar7;
            _Var4 = arg_is_token(pcVar10,"vr-config");
            bVar2 = 1;
            if (_Var4) {
              local_106c = 2;
            }
            else {
              _Var4 = arg_is_token(pcVar10,"fan-table");
              local_106c = 1;
              if (!_Var4) {
                uVar6 = 0xffffffff;
                if (quiet == '\0') {
                  pcVar9 = "Error: Bad payload type argument %s\n";
                  goto LAB_001087eb;
                }
                goto LAB_001087a7;
              }
            }
          }
        }
      }
      ppcVar7 = ppcVar7 + 2;
      argc = argc + -2;
    } while (argc != 0);
    if ((bool)(bVar8 & bVar2 & p_path != (char *)0x0)) {
      device_path_found = (char *)0x0;
      payload_size = 0;
      handle.ctx = (igsc_lib_ctx *)0x0;
      if ((pcVar9 != (char *)0x0) ||
         (iVar5 = get_first_device(&device_path_found), pcVar9 = device_path_found,
         device_path_found != (char *)0x0 && iVar5 == 0)) {
        pcVar10 = device_path_found;
        iVar5 = read_from_file_to_buf(p_path,payload,0x1000,&payload_size);
        if (iVar5 == 0) {
          uVar6 = igsc_device_init_by_device(&handle,pcVar9);
          sVar3 = payload_size;
          if (uVar6 == 0) {
            iVar5 = 3;
            do {
              uVar6 = igsc_device_update_late_binding_config
                                (&handle,local_106c,local_1060,payload,sVar3,&local_1054);
              if (uVar6 != 0xd) {
                if (uVar6 == 0) {
                  parse_late_binding_status(local_1054);
                  uVar6 = 0;
                  goto LAB_0010876b;
                }
                break;
              }
              usleep(2000000);
              iVar5 = iVar5 + -1;
            } while (iVar5 != 0);
            if (quiet == '\0') {
              fprintf(_stderr,"Error: Failed to send late binding command: %d\n",(ulong)uVar6);
            }
          }
          else if (quiet == '\0') {
            __format = "Error: Cannot initialize device: %s\n";
            goto LAB_001086d2;
          }
        }
        else {
          uVar6 = 1;
          if (quiet == '\0') {
            __format = "Error: Failed to read file : %s\n";
            pcVar9 = p_path;
LAB_001086d2:
            fprintf(_stderr,__format,pcVar9);
          }
        }
LAB_0010876b:
        igsc_device_close(&handle);
        free(pcVar10);
        goto LAB_001087a7;
      }
      uVar6 = 1;
      if (quiet != '\0') goto LAB_001087a7;
      pcVar9 = "Error: No device to update\n";
      sStack_1080 = 0x1b;
    }
    else {
      uVar6 = 0xffffffff;
      if (quiet != '\0') goto LAB_001087a7;
      pcVar9 = "Error: No payload file or payload type or flags provided\n";
      sStack_1080 = 0x39;
    }
  }
LAB_0010879e:
  fwrite(pcVar9,sStack_1080,1,_stderr);
LAB_001087a7:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return uVar6;
}

Assistant:

static int do_late_binding(int argc, char *argv[])
{
    const char *device_path = NULL;
    const char *payload_path = NULL;
    uint32_t flags = 0;
    bool flags_set = false;
    uint32_t type = 0;
    bool type_set = false;

    if (argc <= 0)
    {
        fwupd_error("No arguments provided\n");
        return ERROR_BAD_ARGUMENT;
    }

    do
    {
        if (arg_is_device(argv[0]))
        {
            if (!arg_next(&argc, &argv))
            {
                fwupd_error("No device to send the command to\n");
                return ERROR_BAD_ARGUMENT;
            }
            device_path = argv[0];
        }
        else if (arg_is_payload(argv[0]))
        {
            if (!arg_next(&argc, &argv))
            {
                fwupd_error("No payload file to send\n");
                return ERROR_BAD_ARGUMENT;
            }
            payload_path = argv[0];
        }
        else if (arg_is_flags(argv[0]))
        {
            if (!arg_next(&argc, &argv))
            {
                fwupd_error("No flags argument provided\n");
                return ERROR_BAD_ARGUMENT;
            }
            flags = (uint32_t)strtol(argv[0], NULL, 16);
            flags_set = true;
        }
        else if (arg_is_type(argv[0]))
        {
            if (!arg_next(&argc, &argv))
            {
                fwupd_error("No payload type argument provided\n");
                return ERROR_BAD_ARGUMENT;
            }
            if (arg_is_vr_config(argv[0]))
            {
                type = CSC_LATE_BINDING_TYPE_VR_CONFIG;
            }
            else if (arg_is_fan_table(argv[0]))
            {
                type = CSC_LATE_BINDING_TYPE_FAN_TABLE;
            }
            else
            {
                fwupd_error("Bad payload type argument %s\n", argv[0]);
                return ERROR_BAD_ARGUMENT;
            }
            type_set = true;
        }
        else
        {
            fwupd_error("Wrong argument %s\n", argv[0]);
            return ERROR_BAD_ARGUMENT;
        }
    } while(arg_next(&argc, &argv));

    if (payload_path && flags_set && type_set)
    {
        return late_binding(device_path, payload_path, type, flags);
    }

    fwupd_error("No payload file or payload type or flags provided\n");
    return ERROR_BAD_ARGUMENT;
}